

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O1

int shared_recover(int id)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  int idx;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  iVar4 = 0x9a;
  if ((shared_gt != (SHARED_GTAB *)0x0) && (shared_lt != (SHARED_LTAB *)0x0)) {
    if (shared_maxseg < 1) {
      iVar4 = 0;
    }
    else {
      lVar7 = 0x14;
      lVar8 = 8;
      uVar6 = 0;
      iVar4 = 0;
      do {
        if (((id == -1 || (uint)id == uVar6) && (*(int *)((long)&shared_lt->p + lVar8) == 0)) &&
           (*(int *)((long)shared_gt + lVar7 + -0xc) != -1)) {
          idx = (int)uVar6;
          iVar2 = shared_mux(idx,3);
          if (iVar2 == 0) {
            uVar3 = semctl(*(int *)((long)shared_gt + lVar7 + -0x14),0,0xc,0);
            uVar1 = *(uint *)((long)&shared_gt->sem + lVar7);
            if (uVar3 == 0 || (int)uVar3 < (int)uVar1) {
              if (shared_debug != 0) {
                printf("Bogus handle=%d nproc=%d sema=%d:",uVar6 & 0xffffffff,(ulong)uVar1,
                       (ulong)uVar3);
              }
              iVar4 = shared_destroy_entry(idx);
              if (shared_debug != 0) {
                pcVar5 = "error couldn\'t clear handle";
                if (iVar4 == 0) {
                  pcVar5 = "handle cleared";
                }
                printf("%s",pcVar5);
              }
            }
            shared_demux(idx,1);
          }
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x1c;
        lVar8 = lVar8 + 0x18;
      } while ((long)uVar6 < (long)shared_maxseg);
    }
  }
  return iVar4;
}

Assistant:

int     shared_recover(int id)                  /* try to recover dormant segments after applic crash */
 { int i, r, r2;

   if (NULL == shared_gt) return(SHARED_NOTINIT);       /* not initialized */
   if (NULL == shared_lt) return(SHARED_NOTINIT);       /* not initialized */
   r = SHARED_OK;
   for (i=0; i<shared_maxseg; i++)
    { if (-1 != id) if (i != id) continue;
      if (shared_lt[i].tcnt) continue;          /* somebody (we) is using it */
      if (SHARED_INVALID == shared_gt[i].key) continue; /* unused slot */
      if (shared_mux(i, SHARED_NOWAIT | SHARED_RDWRITE)) continue; /* acquire exclusive access to segment, but do not wait */
      r2 = shared_process_count(shared_gt[i].sem);
      if ((shared_gt[i].nprocdebug > r2) || (0 == r2))
        { if (shared_debug) printf("Bogus handle=%d nproc=%d sema=%d:", i, shared_gt[i].nprocdebug, r2);
          r = shared_destroy_entry(i);
          if (shared_debug)
            { printf("%s", r ? "error couldn't clear handle" : "handle cleared");
            }
        }
      shared_demux(i, SHARED_RDWRITE);
    }
   return(r);                                           /* table full */
 }